

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AddWeak
          (RepeatedPtrFieldBase *this,MessageLite *prototype)

{
  Arena *this_00;
  int iVar1;
  Rep *pRVar2;
  undefined4 extraout_var;
  MessageLite *pMVar3;
  int iVar4;
  
  pRVar2 = this->rep_;
  if (pRVar2 == (Rep *)0x0) {
    iVar1 = this->current_size_;
    iVar4 = this->total_size_;
  }
  else {
    iVar1 = this->current_size_;
    iVar4 = pRVar2->allocated_size;
    if (iVar1 < iVar4) {
      this->current_size_ = iVar1 + 1;
      return (MessageLite *)pRVar2->elements[iVar1];
    }
    if (iVar4 != this->total_size_) goto LAB_00272606;
  }
  if (iVar1 <= iVar4) {
    InternalExtend(this,(iVar4 - iVar1) + 1);
    pRVar2 = this->rep_;
  }
LAB_00272606:
  pRVar2->allocated_size = pRVar2->allocated_size + 1;
  this_00 = this->arena_;
  if (prototype == (MessageLite *)0x0) {
    if (this_00 == (Arena *)0x0) {
      pMVar3 = (MessageLite *)operator_new(0x30);
      pMVar3->_vptr_MessageLite = (_func_int **)&PTR__ImplicitWeakMessage_00620b78;
      pMVar3[1]._vptr_MessageLite = (_func_int **)0x0;
      pMVar3[2]._vptr_MessageLite = (_func_int **)(pMVar3 + 4);
      pMVar3[3]._vptr_MessageLite = (_func_int **)0x0;
    }
    else {
      if (this_00->hooks_cookie_ != (void *)0x0) {
        Arena::OnArenaAllocation(this_00,(type_info *)&ImplicitWeakMessage::typeinfo,0x30);
      }
      pMVar3 = (MessageLite *)
               ArenaImpl::AllocateAlignedAndAddCleanup
                         (&this_00->impl_,0x30,
                          arena_destruct_object<google::protobuf::internal::ImplicitWeakMessage>);
      pMVar3->_vptr_MessageLite = (_func_int **)&PTR__ImplicitWeakMessage_00620b78;
      pMVar3[1]._vptr_MessageLite = (_func_int **)this_00;
      pMVar3[2]._vptr_MessageLite = (_func_int **)(pMVar3 + 4);
      pMVar3[3]._vptr_MessageLite = (_func_int **)0x0;
    }
    *(undefined1 *)&pMVar3[4]._vptr_MessageLite = 0;
  }
  else {
    iVar1 = (*prototype->_vptr_MessageLite[4])(prototype,this_00);
    pMVar3 = (MessageLite *)CONCAT44(extraout_var,iVar1);
  }
  iVar1 = this->current_size_;
  this->current_size_ = iVar1 + 1;
  this->rep_->elements[iVar1] = pMVar3;
  return pMVar3;
}

Assistant:

MessageLite* RepeatedPtrFieldBase::AddWeak(const MessageLite* prototype) {
  if (rep_ != NULL && current_size_ < rep_->allocated_size) {
    return reinterpret_cast<MessageLite*>(rep_->elements[current_size_++]);
  }
  if (!rep_ || rep_->allocated_size == total_size_) {
    Reserve(total_size_ + 1);
  }
  ++rep_->allocated_size;
  MessageLite* result = prototype
                            ? prototype->New(arena_)
                            : Arena::CreateMessage<ImplicitWeakMessage>(arena_);
  rep_->elements[current_size_++] = result;
  return result;
}